

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

int lws_humanize(char *p,int len,uint64_t v,lws_humanize_unit_t *schema)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  char **ppcVar16;
  byte bVar17;
  int iVar18;
  ulong uVar19;
  lws_humanize_unit_t *plVar20;
  ulong uVar21;
  long lVar22;
  char *format;
  ulong uVar23;
  long lVar24;
  byte bVar25;
  long lVar26;
  bool bVar27;
  
  plVar20 = schema + 1;
  while ((uVar19 = plVar20[-1].factor, v < uVar19 && (uVar19 != 1))) {
    ppcVar16 = &plVar20->name;
    plVar20 = plVar20 + 1;
    if (*ppcVar16 == (char *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/libwebsockets.c"
                    ,0x4a0,"int lws_humanize(char *, int, uint64_t, const lws_humanize_unit_t *)");
    }
  }
  *p = ' ';
  if (uVar19 != 1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = plVar20[-1].factor;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = v;
    uVar19 = SUB168(auVar3 / auVar1,0);
    bVar17 = 0x20;
    if (plVar20[-1].factor <= v) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar19;
      bVar17 = SUB161(auVar3 / auVar1,0) +
               ((byte)(SUB164(auVar8 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 | 0x30;
    }
    p[4] = bVar17;
    if (uVar19 < 10) {
      p[3] = ' ';
LAB_0010f76b:
      p[2] = ' ';
      bVar17 = 0x20;
    }
    else {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar19 / 10;
      p[3] = (char)(uVar19 / 10) + SUB161(auVar9 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      if (uVar19 < 100) goto LAB_0010f76b;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar19 / 100;
      p[2] = (char)(uVar19 / 100) + SUB161(auVar13 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      bVar17 = 0x20;
      if (999 < uVar19) {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar19 / 1000;
        bVar17 = 0x21;
        if (uVar19 < 10000) {
          bVar17 = (char)(uVar19 / 1000) + SUB161(auVar14 * ZEXT816(0x199999999999999a),8) * -10 |
                   0x30;
        }
      }
    }
    p[1] = bVar17;
    p[5] = '.';
    uVar21 = v % plVar20[-1].factor;
    uVar23 = plVar20[-1].factor / 1000;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar23;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar21;
    uVar19 = SUB168(auVar4 / auVar2,0);
    bVar17 = 0x30;
    if (uVar23 <= uVar21) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar19;
      bVar17 = SUB161(auVar4 / auVar2,0) +
               ((byte)(SUB164(auVar10 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 | 0x30;
    }
    p[8] = bVar17;
    if (uVar19 < 10) {
      lVar22 = -0x900000000;
      p[7] = '0';
      format = "%s";
      lVar24 = 9;
      lVar26 = 6;
      bVar17 = 0x30;
      goto LAB_0010f8be;
    }
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar19 / 10;
    lVar22 = -0x900000000;
    p[7] = (char)(uVar19 / 10) + SUB161(auVar11 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
    format = "%s";
    lVar24 = 9;
    lVar26 = 6;
    bVar17 = 0x30;
    if (uVar19 < 100) goto LAB_0010f8be;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar19 / 100;
    bVar25 = (char)(uVar19 / 100) + SUB161(auVar12 * ZEXT816(0x199999999999999a),8) * -10;
    bVar27 = uVar19 < 1000;
LAB_0010f88b:
    bVar17 = 0x21;
    if (bVar27) {
      bVar17 = bVar25 | 0x30;
    }
    goto LAB_0010f8be;
  }
  lVar22 = -0x500000000;
  if (v == 0) {
    p[4] = ' ';
LAB_0010f89d:
    p[3] = ' ';
  }
  else {
    cVar15 = (char)(v / 10);
    p[4] = (char)v + cVar15 * -10 | 0x30;
    if (v < 10) goto LAB_0010f89d;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = v / 10;
    p[3] = cVar15 + SUB161(auVar5 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
    if (99 < v) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = v / 100;
      p[2] = (char)(v / 100) + SUB161(auVar6 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      format = "%s    ";
      lVar24 = 5;
      lVar26 = 1;
      bVar17 = 0x20;
      if (v < 1000) goto LAB_0010f8be;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = v / 1000;
      bVar25 = (char)(v / 1000) + SUB161(auVar7 * ZEXT816(0x199999999999999a),8) * -10;
      bVar27 = v < 10000;
      goto LAB_0010f88b;
    }
  }
  p[2] = ' ';
  format = "%s    ";
  lVar24 = 5;
  lVar26 = 1;
  bVar17 = 0x20;
LAB_0010f8be:
  p[lVar26] = bVar17;
  iVar18 = lws_snprintf(p + lVar24,(long)(((ulong)(uint)len << 0x20) + lVar22) >> 0x20,format,
                        plVar20[-1].name);
  return iVar18;
}

Assistant:

int
lws_humanize(char *p, int len, uint64_t v, const lws_humanize_unit_t *schema)
{
	char *end = p + len;

	do {
		if (v >= schema->factor || schema->factor == 1) {
			if (schema->factor == 1) {
				*p++ = ' ';
				p += decim(p, v, 4, 0);
				return lws_snprintf(p, lws_ptr_diff(end, p),
						    "%s    ", schema->name);
			}

			*p++ = ' ';
			p += decim(p, v / schema->factor, 4, 0);
			*p++ = '.';
			p += decim(p, (v % schema->factor) /
					(schema->factor / 1000), 3, 1);

			return lws_snprintf(p, lws_ptr_diff(end, p),
					    "%s", schema->name);
		}
		schema++;
	} while (schema->name);

	assert(0);
	strncpy(p, "unknown value", len);

	return 0;
}